

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O1

ostream * amrex::operator<<(ostream *os,Geometry *g)

{
  ostream *poVar1;
  char local_1d;
  IntVect local_1c;
  
  poVar1 = operator<<(os,&g->super_CoordSys);
  poVar1 = operator<<(poVar1,&g->prob_domain);
  poVar1 = operator<<(poVar1,&g->domain);
  local_1d = 'P';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1d,1);
  local_1c.vect[0] = (int)(byte)(g->super_CoordSys).field_0x51;
  local_1c.vect[1] = (int)(byte)(g->super_CoordSys).field_0x52;
  local_1c.vect[2] = (int)(byte)(g->super_CoordSys).field_0x53;
  operator<<(poVar1,&local_1c);
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&   os,
            const Geometry& g)
{
    os << (CoordSys&) g << g.ProbDomain() << g.Domain() << 'P' << IntVect(g.isPeriodic());
    return os;
}